

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void HFSubConsumer::ringbufController(zsock_t *pipe,void *args)

{
  zsock_t *pzVar1;
  char *pcVar2;
  long *in_RSI;
  zsock_t *in_RDI;
  zloop_t *loop;
  HFSubConsumer *self;
  zloop_t *local_20;
  long *local_18;
  long *local_10;
  zsock_t *local_8;
  
  in_RSI[0x14] = (long)in_RDI;
  local_18 = in_RSI;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pzVar1 = zsock_new_checked(4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
                             ,0xc6);
  local_18[0x71] = (long)pzVar1;
  zsock_bind((zsock_t *)local_18[0x71],"inproc://rep_%p",local_10);
  pcVar2 = zsock_endpoint((zsock_t *)local_18[0x71]);
  std::__cxx11::string::operator=((string *)(local_18 + 0x72),pcVar2);
  zsock_signal(local_8,'\0');
  local_20 = zloop_new();
  zloop_reader(local_20,local_8,HighFreqSub::pipeController,local_18);
  (**(code **)(*local_18 + 0x20))(local_18,local_20);
  zloop_start(local_20);
  zloop_destroy(&local_20);
  zsock_destroy_checked
            ((zsock_t **)(local_18 + 0x71),
             "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
             ,0xd1);
  zsock_signal(local_8,'\0');
  return;
}

Assistant:

void HFSubConsumer::ringbufController(zsock_t *pipe, void *args){
    HFSubConsumer *self = (HFSubConsumer*)args;
    self->usrpipe = pipe;

    //Bind rep to custom endpoint
    self->rep = zsock_new(ZMQ_REP);
    zsock_bind(self->rep, "inproc://rep_%p", args);
    self->rependpoint = zsock_endpoint(self->rep);

    //Initialize loop
    zsock_signal(pipe, 0);
    zloop_t *loop = zloop_new();
    zloop_reader(loop, pipe, pipeController, self);
    self->sub_reader(loop);
    zloop_start(loop);
    zloop_destroy(&loop);
    zsock_destroy(&self->rep);
    zsock_signal(pipe, 0);
}